

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O3

int __thiscall
deqp::egl::NegativePartialUpdateTests::init(NegativePartialUpdateTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCase *pTVar1;
  
  pTVar1 = (TestCase *)operator_new(0xa8);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"not_postable_surface",
                     "Call setDamageRegion() on pbuffer");
  *(undefined1 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 1;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_0211ff50;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0xa8);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"not_current_surface",
                     "Call setDamageRegion() on pbuffer");
  *(undefined1 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_0211fff0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0xa8);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"buffer_preserved",
                     "Call setDamageRegion() on pbuffer");
  *(undefined1 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
  *(undefined4 *)((long)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_02120040;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0xa8);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"set_damage_region_twice",
                     "Call setDamageRegion() twice");
  *(undefined1 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_02120090;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0xa8);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,
                     "set_damage_region_before_query_age",
                     "Call setDamageRegion() without querying buffer age");
  *(undefined1 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_021200e0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0xa8);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pass_null_0_as_params",
                     "Call setDamageRegion() with (NULL, 0)");
  *(undefined1 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_02120130;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0xa8);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"not_current_surface2",
                     "Call setDamageRegion() on pbuffer");
  *(undefined1 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined4 *)((long)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_02120180;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void NegativePartialUpdateTests::init (void)
{
	addChild(new NotPostableTest(m_eglTestCtx));
	addChild(new NotCurrentSurfaceTest(m_eglTestCtx));
	addChild(new BufferPreservedTest(m_eglTestCtx));
	addChild(new SetTwiceTest(m_eglTestCtx));
	addChild(new NoAgeTest(m_eglTestCtx));
	addChild(new PassNullTest(m_eglTestCtx));
	addChild(new NotCurrentSurfaceTest2(m_eglTestCtx));
}